

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> * __thiscall
fmt::v8::make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,int&>
          (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int>
           *__return_storage_ptr__,v8 *this,int *args)

{
  int *args_local;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> *local_68;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  int *arg;
  
  local_68._0_4_ = (__return_storage_ptr__->data_).args_[0].field_0.int_value;
  return local_68;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {std::forward<Args>(args)...};
}